

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-desc.c
# Opt level: O3

void monster_desc(char *desc,size_t max,monster *mon,wchar_t mode)

{
  _Bool _Var1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  bitflag *flags;
  monster_race *pmVar6;
  
  if (mon == (monster *)0x0) {
    __assert_fail("mon != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-desc.c"
                  ,0x6e,"void monster_desc(char *, size_t, const struct monster *, int)");
  }
  if (-1 < (char)(byte)mode) {
    if ((mode & 0x40U) == 0) {
      _Var1 = monster_is_visible(mon);
      if (((byte)mode >> 5 & _Var1) != 0) goto LAB_001651d8;
      if (_Var1) goto LAB_00165197;
    }
    if ((mode & 0x10U) == 0) {
      iVar4 = 0;
    }
    else {
LAB_001651d8:
      _Var1 = flag_has_dbg(mon->race->flags,0xb,4,"mon->race->flags","RF_FEMALE");
      iVar4 = 0x20;
      if (!_Var1) {
        _Var1 = flag_has_dbg(mon->race->flags,0xb,3,"mon->race->flags","RF_MALE");
        iVar4 = (uint)_Var1 << 4;
      }
    }
    uVar2 = ((mode & 7U) + iVar4) - 2;
    if (uVar2 < 0x26) {
      pcVar5 = &DAT_00260d00 + *(int *)(&DAT_00260d00 + (ulong)uVar2 * 4);
    }
    else {
      pcVar5 = "it";
    }
LAB_00165257:
    my_strcpy(desc,pcVar5,max);
    goto LAB_00165262;
  }
  if ((mode & 0x20U) != 0) goto LAB_001651d8;
LAB_00165197:
  flags = mon->race->flags;
  if ((~mode & 3U) == 0) {
    _Var1 = flag_has_dbg(flags,0xb,4,"mon->race->flags","RF_FEMALE");
    if (_Var1) {
      pcVar5 = "herself";
    }
    else {
      _Var1 = flag_has_dbg(mon->race->flags,0xb,3,"mon->race->flags","RF_MALE");
      if (_Var1) {
        pcVar5 = "himself";
      }
      else {
        pcVar5 = "itself";
      }
    }
    goto LAB_00165257;
  }
  _Var1 = flag_has_dbg(flags,0xb,1,"mon->race->flags","RF_UNIQUE");
  if (_Var1) {
    pmVar6 = mon->race;
    if ((mode & 2U) != 0) {
      _Var1 = flag_has_dbg(pmVar6->flags,0xb,6,"mon->race->flags","RF_NAME_COMMA");
      pmVar6 = mon->race;
      if (_Var1) {
        pcVar5 = pmVar6->name;
        pcVar3 = strchr(pcVar5,0x2c);
        if ((pcVar3 == (char *)0x0) || (0x3ff < (long)pcVar3 - (long)pcVar5)) goto LAB_0016536a;
        strnfmt(desc,max,"%.*s",(long)pcVar3 - (long)pcVar5 & 0xffffffff,pcVar5);
        goto LAB_0016543a;
      }
    }
LAB_0016536a:
    my_strcpy(desc,pmVar6->name,max);
  }
  else {
    if ((mode & 8U) == 0) {
      pcVar5 = "the ";
    }
    else {
      _Var1 = is_a_vowel((int)*mon->race->name);
      pcVar5 = "a ";
      if (_Var1) {
        pcVar5 = "an ";
      }
    }
    my_strcpy(desc,pcVar5,max);
    pmVar6 = mon->race;
    if ((mode & 2U) == 0) {
LAB_0016542a:
      pcVar5 = pmVar6->name;
    }
    else {
      _Var1 = flag_has_dbg(pmVar6->flags,0xb,6,"mon->race->flags","RF_NAME_COMMA");
      pmVar6 = mon->race;
      if (!_Var1) goto LAB_0016542a;
      pcVar5 = pmVar6->name;
      pcVar3 = strchr(pcVar5,0x2c);
      if ((pcVar3 == (char *)0x0) || (0x3ff < (long)pcVar3 - (long)pcVar5)) goto LAB_0016542a;
      pcVar5 = format("%.*s",(long)pcVar3 - (long)pcVar5 & 0xffffffff,pcVar5);
    }
    my_strcat(desc,pcVar5,max);
  }
LAB_0016543a:
  if (((uint)mode >> 9 & 1) != 0) {
    _Var1 = flag_has_dbg(mon->race->flags,0xb,6,"mon->race->flags","RF_NAME_COMMA");
    if (_Var1) {
      my_strcat(desc,",",max);
    }
  }
  if ((mode & 2U) != 0) {
    my_strcat(desc,"\'s",max);
  }
  _Var1 = panel_contains((mon->grid).y,(mon->grid).x);
  if (!_Var1) {
    my_strcat(desc," (offscreen)",max);
  }
LAB_00165262:
  if (((uint)mode >> 8 & 1) == 0) {
    return;
  }
  my_strcap(desc);
  return;
}

Assistant:

void monster_desc(char *desc, size_t max, const struct monster *mon, int mode)
{
	assert(mon != NULL);

	/* Can we see it? (forced, or not hidden + visible) */
	bool seen = (mode & MDESC_SHOW) ||
		(!(mode & MDESC_HIDE) && monster_is_visible(mon));

	/* Sexed pronouns (seen and forced, or unseen and allowed) */
	bool use_pronoun = (seen && (mode & MDESC_PRO_VIS)) ||
			(!seen && (mode & MDESC_PRO_HID));

	/* First, try using pronouns, or describing hidden monsters */
	if (!seen || use_pronoun) {
		const char *choice = "it";

		/* an encoding of the monster "sex" */
		int msex = 0x00;

		/* Extract the gender (if applicable) */
		if (use_pronoun) {
			if (rf_has(mon->race->flags, RF_FEMALE)) {
				msex = 0x20;
			} else if (rf_has(mon->race->flags, RF_MALE)) {
				msex = 0x10;
			}
		}

		/* Brute force: split on the possibilities */
		switch (msex + (mode & 0x07)) {
			/* Neuter */
			case 0x00: choice = "it"; break;
			case 0x01: choice = "it"; break;
			case 0x02: choice = "its"; break;
			case 0x03: choice = "itself"; break;
			case 0x04: choice = "something"; break;
			case 0x05: choice = "something"; break;
			case 0x06: choice = "something's"; break;
			case 0x07: choice = "itself"; break;

			/* Male */
			case 0x10: choice = "he"; break;
			case 0x11: choice = "him"; break;
			case 0x12: choice = "his"; break;
			case 0x13: choice = "himself"; break;
			case 0x14: choice = "someone"; break;
			case 0x15: choice = "someone"; break;
			case 0x16: choice = "someone's"; break;
			case 0x17: choice = "himself"; break;

			/* Female */
			case 0x20: choice = "she"; break;
			case 0x21: choice = "her"; break;
			case 0x22: choice = "her"; break;
			case 0x23: choice = "herself"; break;
			case 0x24: choice = "someone"; break;
			case 0x25: choice = "someone"; break;
			case 0x26: choice = "someone's"; break;
			case 0x27: choice = "herself"; break;
		}

		my_strcpy(desc, choice, max);
	} else if ((mode & MDESC_POSS) && (mode & MDESC_OBJE)) {
		/* The monster is visible, so use its gender */
		if (rf_has(mon->race->flags, RF_FEMALE))
			my_strcpy(desc, "herself", max);
		else if (rf_has(mon->race->flags, RF_MALE))
			my_strcpy(desc, "himself", max);
		else
			my_strcpy(desc, "itself", max);
	} else {
		const char *comma_pos;

		/* Unique, indefinite or definite */
		if (rf_has(mon->race->flags, RF_UNIQUE)) {
			/* Start with the name (thus nominative and objective) */
			/*
			 * Strip off descriptive phrase if a possessive will be
			 * added.
			 */
			if ((mode & MDESC_POSS)
					&& rf_has(mon->race->flags, RF_NAME_COMMA)
					&& (comma_pos = strchr(mon->race->name, ','))
					&& comma_pos - mon->race->name < 1024) {
				strnfmt(desc, max, "%.*s",
					(int) (comma_pos - mon->race->name),
					mon->race->name);
			} else {
				my_strcpy(desc, mon->race->name, max);
			}
		} else {
			if (mode & MDESC_IND_VIS) {
				/* XXX Check plurality for "some" */
				/* Indefinite monsters need an indefinite article */
				my_strcpy(desc, is_a_vowel(mon->race->name[0]) ? "an " : "a ", max);
			} else {
				/* Definite monsters need a definite article */
				my_strcpy(desc, "the ", max);
			}

			/*
			 * As with uniques, strip off phrase if a possessive
			 * will be added.
			 */
			if ((mode & MDESC_POSS)
					&& rf_has(mon->race->flags, RF_NAME_COMMA)
					&& (comma_pos = strchr(mon->race->name, ','))
					&& comma_pos - mon->race->name < 1024) {
				my_strcat(desc, format("%.*s",
					(int) (comma_pos - mon->race->name),
					mon->race->name), max);
			} else {
				my_strcat(desc, mon->race->name, max);
			}
		}

		if ((mode & MDESC_COMMA)
				&& rf_has(mon->race->flags, RF_NAME_COMMA)) {
			my_strcat(desc, ",", max);
		}

		/* Handle the possessive */
		/* XXX Check for trailing "s" */
		if (mode & MDESC_POSS) {
			my_strcat(desc, "'s", max);
		}

		/* Mention "offscreen" monsters */
		if (!panel_contains(mon->grid.y, mon->grid.x)) {
			my_strcat(desc, " (offscreen)", max);
		}
	}

	if (mode & MDESC_CAPITAL) {
		my_strcap(desc);
	}
}